

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O0

AggregateFunction *
duckdb::
GetTypedMedianAbsoluteDeviationAggregateFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
          (LogicalType *input_type,LogicalType *target_type)

{
  LogicalType *in_RDX;
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  LogicalType *in_stack_ffffffffffffff88;
  AggregateFunction *this;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  this = in_RDI;
  LogicalType::LogicalType((LogicalType *)in_RDI,in_stack_ffffffffffffff88);
  LogicalType::LogicalType((LogicalType *)this,in_stack_ffffffffffffff88);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t,duckdb::interval_t,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>,(duckdb::AggregateDestructorType)1>
            (in_RDX,(LogicalType *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  LogicalType::~LogicalType((LogicalType *)0x1cc9e65);
  LogicalType::~LogicalType((LogicalType *)0x1cc9e6f);
  this->bind = BindMAD;
  this->order_dependent = NOT_ORDER_DEPENDENT;
  this->window = MedianAbsoluteDeviationOperation<duckdb::timestamp_t>::
                 Window<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t,duckdb::interval_t>
  ;
  this->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::timestamp_t>
  ;
  return in_RDI;
}

Assistant:

AggregateFunction GetTypedMedianAbsoluteDeviationAggregateFunction(const LogicalType &input_type,
                                                                   const LogicalType &target_type) {
	using STATE = QuantileState<INPUT_TYPE, QuantileStandardType>;
	using OP = MedianAbsoluteDeviationOperation<MEDIAN_TYPE>;
	auto fun = AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, TARGET_TYPE, OP,
	                                                       AggregateDestructorType::LEGACY>(input_type, target_type);
	fun.bind = BindMAD;
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
	fun.window = OP::template Window<STATE, INPUT_TYPE, TARGET_TYPE>;
	fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
	return fun;
}